

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O2

void __thiscall Js::BoundFunction::ProcessCorePaths(BoundFunction *this)

{
  TTD::RuntimeContextInfo::EnqueueNewPathVarAsNeeded
            (((((((this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.type.
                 ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
             TTDWellKnownInfo,(RecyclableObject *)this,(this->targetFunction).ptr,L"!targetFunction"
             ,(char16 *)0x0);
  TTD::RuntimeContextInfo::EnqueueNewPathVarAsNeeded
            (((((((this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.type.
                 ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
             TTDWellKnownInfo,(RecyclableObject *)this,(this->boundThis).ptr,L"!boundThis",
             (char16 *)0x0);
  if (this->count == 0) {
    return;
  }
  TTDAbort_unrecoverable_error("Should only have empty args in core image");
}

Assistant:

void BoundFunction::ProcessCorePaths()
    {
        this->GetScriptContext()->TTDWellKnownInfo->EnqueueNewPathVarAsNeeded(this, this->targetFunction, _u("!targetFunction"));
        this->GetScriptContext()->TTDWellKnownInfo->EnqueueNewPathVarAsNeeded(this, this->boundThis, _u("!boundThis"));

        TTDAssert(this->count == 0, "Should only have empty args in core image");
    }